

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall DifferingTypesTest::typePromotionTest(DifferingTypesTest *this)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  byte *pbVar7;
  size_t j;
  ulong it;
  size_t shape [2];
  Marray<int,_std::allocator<unsigned_long>_> b;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> a;
  allocator_type local_f1;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Plus<int,_unsigned_char,_int>_>
  local_f0;
  unsigned_long local_d8 [3];
  Marray<int,_std::allocator<unsigned_long>_> local_c0;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> local_78;
  
  local_d8[0] = 3;
  local_d8[1] = 4;
  local_c0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_1_ =
       (Marray<int,std::allocator<unsigned_long>>)0xfa;
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&local_78,local_d8,local_d8 + 2,
             (uchar *)&local_c0,&andres::defaultOrder,(allocator_type *)&local_f0);
  local_f0.e1_ = (expression_type_1 *)CONCAT44(local_f0.e1_._4_4_,1000);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_c0,local_d8,local_d8 + 2,
             (int *)&local_f0,&andres::defaultOrder,&local_f1);
  for (it = 0; it < local_78.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                    geometry_.size_; it = it + 1) {
    andres::
    BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<unsigned_char,_int,_int>_>
    ::BinaryViewExpression
              ((BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<unsigned_char,_int,_int>_>
                *)&local_f0,
               (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                *)&local_78,
               (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
               &local_c0);
    vVar1 = andres::
            BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<unsigned_char,int,int>>
            ::operator()((BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<unsigned_char,int,int>>
                          *)&local_f0,it);
    local_f1 = (allocator_type)(vVar1 == 0x4e2);
    test((bool *)&local_f1);
    andres::
    BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<unsigned_char,_int,_int>_>
    ::BinaryViewExpression
              ((BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<unsigned_char,_int,_int>_>
                *)&local_f0,
               (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                *)&local_78,
               (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
               &local_c0);
    vVar2 = andres::
            BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Minus<unsigned_char,int,int>>
            ::operator()((BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Minus<unsigned_char,int,int>>
                          *)&local_f0,it);
    local_f1 = (allocator_type)(vVar2 == -0x2ee);
    test((bool *)&local_f1);
    andres::
    BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Plus<int,_unsigned_char,_int>_>
    ::BinaryViewExpression
              (&local_f0,
               (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
               &local_c0,
               (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                *)&local_78);
    vVar3 = andres::
            BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Plus<int,unsigned_char,int>>
            ::operator()((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Plus<int,unsigned_char,int>>
                          *)&local_f0,it);
    local_f1 = (allocator_type)(vVar3 == 0x4e2);
    test((bool *)&local_f1);
    andres::
    BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Minus<int,_unsigned_char,_int>_>
    ::BinaryViewExpression
              ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Minus<int,_unsigned_char,_int>_>
                *)&local_f0,
               (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
               &local_c0,
               (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                *)&local_78);
    vVar4 = andres::
            BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Minus<int,unsigned_char,int>>
            ::operator()((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Minus<int,unsigned_char,int>>
                          *)&local_f0,it);
    local_f1 = (allocator_type)(vVar4 == 0x2ee);
    test((bool *)&local_f1);
    local_f0.e2_._0_4_ = 4;
    local_f0.e1_ = (expression_type_1 *)&local_78;
    vVar5 = andres::
            BinaryViewExpressionScalarFirst<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<int,unsigned_char,int>>
            ::operator()((BinaryViewExpressionScalarFirst<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<int,unsigned_char,int>>
                          *)&local_f0,it);
    pbVar7 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&local_78,it);
    local_f1 = (allocator_type)(vVar5 == (uint)*pbVar7 << 2);
    test((bool *)&local_f1);
    local_f0.e2_._0_4_ = 4;
    local_f0.e1_ = (expression_type_1 *)&local_78;
    vVar6 = andres::
            BinaryViewExpressionScalarSecond<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<unsigned_char,int,int>>
            ::operator()((BinaryViewExpressionScalarSecond<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<unsigned_char,int,int>>
                          *)&local_f0,it);
    pbVar7 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&local_78,it);
    local_f1 = (allocator_type)(vVar6 == (uint)*pbVar7 << 2);
    test((bool *)&local_f1);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_c0);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray(&local_78);
  return;
}

Assistant:

void DifferingTypesTest::typePromotionTest()
{
    std::size_t shape[] = {3, 4};
    andres::Marray<unsigned char> a(shape, shape + 2, 250);
    andres::Marray<int> b(shape, shape + 2, 1000);
    for(std::size_t j=0; j<a.size(); ++j) {
        test((a + b)(j) == 1250);
        test((a - b)(j) == -750);
        test((b + a)(j) == 1250);
        test((b - a)(j) == 750);
        test((4 * a)(j) == 4 * a(j));
        test((a * 4)(j) == a(j) * 4);
    }
}